

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O2

void __thiscall jbcoin::SerialIter::getFieldID(SerialIter *this,int *type,int *name)

{
  uint uVar1;
  byte bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  bVar2 = get8(this);
  *type = (uint)bVar2;
  *name = bVar2 & 0xf;
  uVar1 = *type;
  *type = (int)uVar1 >> 4;
  if (uVar1 < 0x10) {
    bVar2 = get8(this);
    *type = (uint)bVar2;
    if (bVar2 < 0x10) {
      std::__cxx11::to_string(&local_38,(uint)bVar2);
      std::operator+(&bStack_58,"gFID: uncommon type out of range ",&local_38);
      Throw<std::runtime_error,std::__cxx11::string>(&bStack_58);
    }
  }
  if (*name == 0) {
    bVar2 = get8(this);
    *name = (uint)bVar2;
    if (bVar2 < 0x10) {
      std::__cxx11::to_string(&local_38,(uint)bVar2);
      std::operator+(&bStack_58,"gFID: uncommon name out of range ",&local_38);
      Throw<std::runtime_error,std::__cxx11::string>(&bStack_58);
    }
  }
  return;
}

Assistant:

void
SerialIter::getFieldID (int& type, int& name)
{
    type = get8();
    name = type & 15;
    type >>= 4;

    if (type == 0)
    {
        // uncommon type
        type = get8();
        if (type == 0 || type < 16)
            Throw<std::runtime_error> (
                "gFID: uncommon type out of range " +
                    std::to_string(type));
    }

    if (name == 0)
    {
        // uncommon name
        name = get8();
        if (name == 0 || name < 16)
            Throw<std::runtime_error> (
                "gFID: uncommon name out of range " +
                    std::to_string(name));
    }
}